

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O2

bool EV_TeleportGroup(int group_tid,AActor *victim,int source_tid,int dest_tid,bool moveSource,
                     bool fog)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  AActor *source;
  AActor *dest;
  PClass *base;
  AActor *victim_00;
  FName local_6c;
  DAngle local_68;
  FActorIterator iterator;
  DVector3 local_48;
  
  iterator.base = (AActor *)0x0;
  iterator.id = source_tid;
  source = FActorIterator::Next(&iterator);
  if (source == (AActor *)0x0) {
    bVar2 = EV_TeleportOther(group_tid,dest_tid,fog);
  }
  else {
    iterator.base = (AActor *)0x0;
    local_6c.Index = 0x7c;
    iterator.id = dest_tid;
    PClass::FindClass(&local_6c);
    dest = NActorIterator::Next((NActorIterator *)&iterator);
    if (dest == (AActor *)0x0) {
      bVar2 = false;
    }
    else {
      base = PClass::FindClass("TeleportDest2");
      bVar1 = DObject::IsKindOf((DObject *)dest,base);
      if (victim == (AActor *)0x0 || group_tid != 0) {
        iterator.base = (AActor *)0x0;
        bVar2 = false;
        iterator.id = group_tid;
        while (victim_00 = FActorIterator::Next(&iterator), victim_00 != (AActor *)0x0) {
          bVar3 = DoGroupForOne(victim_00,source,dest,!bVar1,fog);
          bVar2 = (bool)(bVar2 | bVar3);
        }
      }
      else {
        bVar2 = DoGroupForOne(victim,source,dest,!bVar1,fog);
      }
      if ((moveSource) && (bVar2 != false)) {
        if (bVar1) {
          local_48.Z = (dest->__Pos).Z;
        }
        else {
          local_48.Z = -2147483648.0;
        }
        local_48.X = (dest->__Pos).X;
        local_48.Y = (dest->__Pos).Y;
        local_68.Degrees = 0.0;
        P_Teleport(source,&local_48,&local_68,4);
        (source->Angles).Yaw.Degrees = (dest->Angles).Yaw.Degrees;
        bVar2 = true;
      }
    }
  }
  return bVar2;
}

Assistant:

bool EV_TeleportGroup (int group_tid, AActor *victim, int source_tid, int dest_tid, bool moveSource, bool fog)
{
	AActor *sourceOrigin, *destOrigin;
	{
		FActorIterator iterator (source_tid);
		sourceOrigin = iterator.Next ();
	}
	if (sourceOrigin == NULL)
	{ // If there is no source origin, behave like TeleportOther
		return EV_TeleportOther (group_tid, dest_tid, fog);
	}

	{
		NActorIterator iterator (NAME_TeleportDest, dest_tid);
		destOrigin = iterator.Next ();
	}
	if (destOrigin == NULL)
	{
		return false;
	}

	bool didSomething = false;
	bool floorz = !destOrigin->IsKindOf (PClass::FindClass("TeleportDest2"));

	// Use the passed victim if group_tid is 0
	if (group_tid == 0 && victim != NULL)
	{
		didSomething = DoGroupForOne (victim, sourceOrigin, destOrigin, floorz, fog);
	}
	else
	{
		FActorIterator iterator (group_tid);

		// For each actor with tid matching arg0, move it to the same
		// position relative to destOrigin as it is relative to sourceOrigin
		// before the teleport.
		while ( (victim = iterator.Next ()) )
		{
			didSomething |= DoGroupForOne (victim, sourceOrigin, destOrigin, floorz, fog);
		}
	}

	if (moveSource && didSomething)
	{
		didSomething |=
			P_Teleport (sourceOrigin, destOrigin->PosAtZ(floorz ? ONFLOORZ : destOrigin->Z()), 0., TELF_KEEPORIENTATION);
		sourceOrigin->Angles.Yaw = destOrigin->Angles.Yaw;
	}

	return didSomething;
}